

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O3

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedInitialDualGuesses<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>
          (NLW2_NLFeeder_C_Impl *this,SingleSparseVecWrtFactory<int,_double> *igw)

{
  int iVar1;
  SparseVectorWriter<int,_double> ig;
  SingleSparseVecWrtFactory<int,_double> *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  
  iVar1 = (*(this->nlf2_c_).InitialDualGuessesNNZ)((this->nlf2_c_).p_user_data_);
  if (iVar1 != 0) {
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8,(size_t)igw);
    local_40 = 0;
    local_30 = std::
               _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:869:11)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:869:11)>
               ::_M_manager;
    local_48 = (SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8;
    (*(this->nlf2_c_).FeedInitialDualGuesses)((this->nlf2_c_).p_user_data_,&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
  }
  return;
}

Assistant:

void mp::NLW2_NLFeeder_C_Impl::FeedInitialDualGuesses(IGWriter& igw) {
  assert(NLF().InitialDualGuessesNNZ);
  if (int nnz = NLF().InitialDualGuessesNNZ(NLF().p_user_data_)) {
    assert(NLF().FeedInitialDualGuesses);
    auto ig = igw.MakeVectorWriter(nnz);
    std::function<void(int, double)> wrt
        = [&ig](int i, double v){
      ig.Write(i, v);
    };
    NLF().FeedInitialDualGuesses(NLF().p_user_data_, &wrt);
  }
}